

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_array.hpp
# Opt level: O1

void __thiscall
boost::
multi_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
::allocate_space(multi_array<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
                 *this)

{
  unsigned_long __n;
  vector<AlphaVector,_std::allocator<AlphaVector>_> *__first;
  vector<AlphaVector,_std::allocator<AlphaVector>_> local_28;
  
  __first = __gnu_cxx::new_allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>::
            allocate((new_allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_> *)
                     &this->field_0x68,
                     (this->
                     super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL>
                     ).
                     super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*>
                     .num_elements_,(void *)0x0);
  this->base_ = __first;
  (this->super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL>).
  super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*>
  .base_ = __first;
  __n = (this->super_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL>).
        super_const_multi_array_ref<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_2UL,_std::vector<AlphaVector,_std::allocator<AlphaVector>_>_*>
        .num_elements_;
  this->allocated_elements_ = __n;
  local_28.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_28.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28.super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__uninitialized_fill_n<false>::
  __uninit_fill_n<std::vector<AlphaVector,std::allocator<AlphaVector>>*,unsigned_long,std::vector<AlphaVector,std::allocator<AlphaVector>>>
            (__first,__n,&local_28);
  std::vector<AlphaVector,_std::allocator<AlphaVector>_>::~vector(&local_28);
  return;
}

Assistant:

void allocate_space() {
    typename Allocator::const_pointer no_hint=0;
    base_ = allocator_.allocate(this->num_elements(),no_hint);
    this->set_base_ptr(base_);
    allocated_elements_ = this->num_elements();
    std::uninitialized_fill_n(base_,allocated_elements_,T());
  }